

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

size_t __thiscall
kws::Parser::FindConstructor
          (Parser *this,string *buffer,string *className,bool headerfile,size_t startPos)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  string localconstructor;
  string constructor;
  ulong local_a0;
  char *local_90;
  char *local_88;
  char local_80 [16];
  char *local_70;
  char *local_68;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
  pcVar7 = ":";
  iVar8 = (int)CONCAT71(in_register_00000009,headerfile);
  local_a0 = CONCAT44(local_a0._4_4_,iVar8);
  if (iVar8 != 0) {
    pcVar7 = " ";
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,(ulong)pcVar7);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)(className->_M_dataplus)._M_p);
  pcVar7 = local_70;
  strlen(local_70);
  uVar3 = std::__cxx11::string::find((char *)buffer,(ulong)pcVar7,startPos);
  uVar4 = std::__cxx11::string::find((char *)buffer,0x175d52,uVar3);
  uVar5 = std::__cxx11::string::find((char *)buffer,0x1689d1,uVar4);
  uVar9 = 0xffffffffffffffff;
  if (((uVar5 != 0xffffffffffffffff) && (uVar4 != 0xffffffffffffffff)) &&
     (uVar3 != 0xffffffffffffffff)) {
    pcVar7 = ":";
    if (headerfile) {
      pcVar7 = " ";
    }
    while( true ) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)buffer);
      pcVar6 = local_88 + 1;
      bVar2 = true;
      do {
        bVar1 = bVar2;
        pcVar6 = pcVar6 + -1;
        bVar2 = false;
      } while (pcVar6 != (char *)0x0);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)buffer);
        std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pcVar6 = local_88 + 1;
        bVar2 = true;
        do {
          bVar1 = bVar2;
          pcVar6 = pcVar6 + -1;
          bVar2 = false;
        } while (pcVar6 != (char *)0x0);
        if (bVar1) {
          uVar9 = std::__cxx11::string::find((char *)buffer,0x175d46,uVar5);
          local_a0 = std::__cxx11::string::find((char *)buffer,0x168cee,uVar5);
          if (uVar9 <= local_a0) {
            local_a0 = 0xffffffffffffffff;
          }
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      uVar9 = local_a0;
      if (bVar2) break;
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90);
      std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,(ulong)pcVar7);
      std::__cxx11::string::_M_append((char *)&local_90,(ulong)(className->_M_dataplus)._M_p);
      pcVar6 = local_90;
      strlen(local_90);
      uVar3 = std::__cxx11::string::find((char *)buffer,(ulong)pcVar6,uVar3 + 1);
      uVar4 = std::__cxx11::string::find((char *)buffer,0x175d52,uVar3);
      uVar5 = std::__cxx11::string::find((char *)buffer,0x1689d1,uVar4);
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      uVar9 = 0xffffffffffffffff;
      if (((uVar5 == 0xffffffffffffffff) || (uVar4 == 0xffffffffffffffff)) ||
         (uVar3 == 0xffffffffffffffff)) break;
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return uVar9;
}

Assistant:

size_t Parser::FindConstructor(const std::string & buffer, const std::string & className,
                               bool headerfile, size_t startPos) const
{
  std::string constructor = "";

  if(headerfile)
    {
    constructor = " ";
    }
  else
    {
    constructor = ":";
    }
  constructor += className;
  size_t pos = buffer.find(constructor.c_str(),startPos);
  size_t pos2 = buffer.find("(",pos);
  size_t pos3 = buffer.find(")",pos2);

  // if it's not the destructor ...
  /*std::string dest = "~";
  dest += className;
  long destructor = buffer.find(dest.c_str(),0);*/
  while(pos != std::string::npos && pos2 != std::string::npos && pos3 != std::string::npos)
    {
    //if(pos != destructor+1) // we have the constructor
      {
      // we look if we have only spaces or \n between pos pos2 and pos3
      std::string val = buffer.substr(pos+className.size()+1,pos2-pos-className.size()-1);
      bool ok = true;
      for (char i : val) {
        if (i != ' ' || i != '\n') {
          ok =false;
        }
      }

      bool ok2 = false;
      if(ok)
        {
        ok2 = true;
        val = buffer.substr(pos2+1,pos3-pos2-1);
        for (char i : val) {
          if (i != ' ' || i != '\n') {
            ok2 =false;
          }
        }
        }

      // if ok2 then we check if the constructor is implemented
      if(ok2)
        {
        size_t pos4 = buffer.find(";",pos3);
        size_t pos5 = buffer.find("{",pos3);

        if(pos5<pos4)
          {
          return pos5;
          }
	return std::string::npos;
        }
      }
    std::string localconstructor = "";
    if(headerfile)
      {
      localconstructor = " ";
      }
    else
      {
      localconstructor = ":";
      }
    localconstructor += className;
    pos = buffer.find(localconstructor.c_str(),pos+1);
    pos2 = buffer.find("(",pos);
    pos3 = buffer.find(")",pos2);
    }

  return std::string::npos;
}